

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlTextReaderPtr xmlNewTextReaderFilename(char *URI)

{
  xmlParserInputBufferPtr input;
  xmlTextReaderPtr pxVar1;
  xmlChar *cur;
  xmlChar *pxVar2;
  
  pxVar1 = (xmlTextReaderPtr)0x0;
  input = xmlParserInputBufferCreateFilename(URI,XML_CHAR_ENCODING_NONE);
  if (input != (xmlParserInputBufferPtr)0x0) {
    pxVar1 = xmlNewTextReader(input,URI);
    if (pxVar1 == (xmlTextReaderPtr)0x0) {
      xmlFreeParserInputBuffer(input);
      pxVar1 = (xmlTextReaderPtr)0x0;
    }
    else {
      *(byte *)&pxVar1->allocs = (byte)pxVar1->allocs | 1;
      if (pxVar1->ctxt->directory == (char *)0x0) {
        cur = (xmlChar *)xmlParserGetDirectory(URI);
        if (cur == (xmlChar *)0x0 || pxVar1->ctxt->directory != (char *)0x0) {
          if (cur == (xmlChar *)0x0) {
            return pxVar1;
          }
        }
        else {
          pxVar2 = xmlStrdup(cur);
          pxVar1->ctxt->directory = (char *)pxVar2;
        }
        (*xmlFree)(cur);
      }
    }
  }
  return pxVar1;
}

Assistant:

xmlTextReaderPtr
xmlNewTextReaderFilename(const char *URI) {
    xmlParserInputBufferPtr input;
    xmlTextReaderPtr ret;
    char *directory = NULL;

    input = xmlParserInputBufferCreateFilename(URI, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
	return(NULL);
    ret = xmlNewTextReader(input, URI);
    if (ret == NULL) {
	xmlFreeParserInputBuffer(input);
	return(NULL);
    }
    ret->allocs |= XML_TEXTREADER_INPUT;
    if (ret->ctxt->directory == NULL)
        directory = xmlParserGetDirectory(URI);
    if ((ret->ctxt->directory == NULL) && (directory != NULL))
        ret->ctxt->directory = (char *) xmlStrdup((xmlChar *) directory);
    if (directory != NULL)
	xmlFree(directory);
    return(ret);
}